

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmelSWIAnalyzerSettings.cpp
# Opt level: O2

void __thiscall
AtmelSWIAnalyzerSettings::LoadSettings(AtmelSWIAnalyzerSettings *this,char *settings)

{
  SimpleArchive text_archive;
  int temp_dl;
  
  SimpleArchive::SimpleArchive(&text_archive);
  SimpleArchive::SetString((char *)&text_archive);
  SimpleArchive::operator>>(&text_archive,&this->mSDAChannel);
  SimpleArchive::operator>>(&text_archive,&temp_dl);
  this->mDecodeLevel = temp_dl;
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSDAChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(&text_archive);
  return;
}

Assistant:

void AtmelSWIAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    text_archive >> mSDAChannel;
    int temp_dl;
    text_archive >> temp_dl;
    mDecodeLevel = static_cast<DecodeLevel>( temp_dl );

    ClearChannels();

    AddChannel( mSDAChannel, CHANNEL_NAME, true );

    UpdateInterfacesFromSettings();
}